

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O1

string * __thiscall
google::protobuf::Join<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
          (string *__return_storage_ptr__,protobuf *this,
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *components,char *delim)

{
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  start;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  start.it_ = *(void ***)(this + 0x10);
  if (start.it_ != (void **)0x0) {
    start.it_ = start.it_ + 1;
  }
  Join<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>>
            (start,(RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(start.it_ + *(int *)(this + 8)),(char *)components,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string Join(const Range& components,
            const char* delim) {
  string result;
  Join(components.begin(), components.end(), delim, &result);
  return result;
}